

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_create_table.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalCreateTable::LogicalCreateTable
          (LogicalCreateTable *this,ClientContext *context,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
          *unbound_info)

{
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var1;
  undefined1 __p [8];
  pointer pCVar2;
  pointer pCVar3;
  SchemaCatalogEntry *pSVar4;
  Binder *info;
  undefined1 local_38 [8];
  shared_ptr<duckdb::Binder,_true> binder;
  
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_CREATE_TABLE);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalCreateTable_017854a0;
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (unbound_info);
  pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (unbound_info);
  pSVar4 = Catalog::GetSchema(context,&pCVar2->catalog,&pCVar3->schema);
  this->schema = pSVar4;
  (this->info).
  super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
       (BoundCreateTableInfo *)0x0;
  Binder::CreateBinder
            ((Binder *)&binder,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  info = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
  _Var1._M_head_impl =
       (unbound_info->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
       )._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (unbound_info->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
  _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
  Binder::BindCreateTableInfo
            ((Binder *)local_38,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)info);
  __p = local_38;
  local_38 = (undefined1  [8])0x0;
  ::std::
  __uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  ::reset((__uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
           *)&this->info,(pointer)__p);
  ::std::
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               *)local_38);
  if (_Var1._M_head_impl != (CreateInfo *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_ParseInfo + 8))();
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

LogicalCreateTable::LogicalCreateTable(ClientContext &context, unique_ptr<CreateInfo> unbound_info)
    : LogicalOperator(LogicalOperatorType::LOGICAL_CREATE_TABLE),
      schema(Catalog::GetSchema(context, unbound_info->catalog, unbound_info->schema)) {
	D_ASSERT(unbound_info->type == CatalogType::TABLE_ENTRY);
	auto binder = Binder::CreateBinder(context);
	info = binder->BindCreateTableInfo(unique_ptr_cast<CreateInfo, CreateTableInfo>(std::move(unbound_info)));
}